

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall
Assimp::PretransformVertices::ComputeAbsoluteTransform(PretransformVertices *this,aiNode *pcNode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  aiNode *paVar33;
  ulong uVar34;
  
  paVar33 = pcNode->mParent;
  if (paVar33 != (aiNode *)0x0) {
    fVar1 = (paVar33->mTransformation).a1;
    fVar2 = (paVar33->mTransformation).a2;
    fVar3 = (paVar33->mTransformation).a3;
    fVar4 = (paVar33->mTransformation).a4;
    fVar5 = (pcNode->mTransformation).b1;
    fVar6 = (pcNode->mTransformation).a1;
    fVar7 = (pcNode->mTransformation).a2;
    fVar8 = (pcNode->mTransformation).c1;
    fVar9 = (pcNode->mTransformation).d1;
    fVar10 = (pcNode->mTransformation).b2;
    fVar11 = (pcNode->mTransformation).c2;
    fVar12 = (pcNode->mTransformation).d2;
    fVar13 = (pcNode->mTransformation).b3;
    fVar14 = (pcNode->mTransformation).a3;
    fVar15 = (pcNode->mTransformation).c3;
    fVar16 = (pcNode->mTransformation).d3;
    fVar17 = (pcNode->mTransformation).b4;
    fVar18 = (pcNode->mTransformation).a4;
    fVar19 = (pcNode->mTransformation).c4;
    fVar20 = (pcNode->mTransformation).d4;
    fVar21 = (paVar33->mTransformation).b2;
    fVar22 = (paVar33->mTransformation).b1;
    fVar23 = (paVar33->mTransformation).b3;
    fVar24 = (paVar33->mTransformation).b4;
    fVar25 = (paVar33->mTransformation).c2;
    fVar26 = (paVar33->mTransformation).c1;
    fVar27 = (paVar33->mTransformation).c3;
    fVar28 = (paVar33->mTransformation).c4;
    fVar29 = (paVar33->mTransformation).d2;
    fVar30 = (paVar33->mTransformation).d1;
    fVar31 = (paVar33->mTransformation).d3;
    fVar32 = (paVar33->mTransformation).d4;
    (pcNode->mTransformation).a1 = fVar9 * fVar4 + fVar8 * fVar3 + fVar6 * fVar1 + fVar2 * fVar5;
    (pcNode->mTransformation).a2 = fVar12 * fVar4 + fVar11 * fVar3 + fVar7 * fVar1 + fVar2 * fVar10;
    (pcNode->mTransformation).a3 = fVar16 * fVar4 + fVar15 * fVar3 + fVar14 * fVar1 + fVar2 * fVar13
    ;
    (pcNode->mTransformation).a4 = fVar4 * fVar20 + fVar3 * fVar19 + fVar1 * fVar18 + fVar2 * fVar17
    ;
    (pcNode->mTransformation).b1 = fVar9 * fVar24 + fVar8 * fVar23 + fVar6 * fVar22 + fVar21 * fVar5
    ;
    (pcNode->mTransformation).b2 =
         fVar12 * fVar24 + fVar11 * fVar23 + fVar7 * fVar22 + fVar21 * fVar10;
    (pcNode->mTransformation).b3 =
         fVar16 * fVar24 + fVar15 * fVar23 + fVar14 * fVar22 + fVar21 * fVar13;
    (pcNode->mTransformation).b4 =
         fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * fVar17;
    (pcNode->mTransformation).c1 = fVar9 * fVar28 + fVar8 * fVar27 + fVar6 * fVar26 + fVar25 * fVar5
    ;
    (pcNode->mTransformation).c2 =
         fVar12 * fVar28 + fVar11 * fVar27 + fVar7 * fVar26 + fVar25 * fVar10;
    (pcNode->mTransformation).c3 =
         fVar16 * fVar28 + fVar15 * fVar27 + fVar14 * fVar26 + fVar25 * fVar13;
    (pcNode->mTransformation).c4 =
         fVar28 * fVar20 + fVar27 * fVar19 + fVar26 * fVar18 + fVar25 * fVar17;
    (pcNode->mTransformation).d1 = fVar9 * fVar32 + fVar8 * fVar31 + fVar6 * fVar30 + fVar5 * fVar29
    ;
    (pcNode->mTransformation).d2 =
         fVar12 * fVar32 + fVar11 * fVar31 + fVar7 * fVar30 + fVar10 * fVar29;
    (pcNode->mTransformation).d3 =
         fVar16 * fVar32 + fVar15 * fVar31 + fVar14 * fVar30 + fVar13 * fVar29;
    (pcNode->mTransformation).d4 =
         fVar20 * fVar32 + fVar19 * fVar31 + fVar18 * fVar30 + fVar29 * fVar17;
  }
  if (pcNode->mNumChildren != 0) {
    uVar34 = 0;
    do {
      ComputeAbsoluteTransform(this,pcNode->mChildren[uVar34]);
      uVar34 = uVar34 + 1;
    } while (uVar34 < pcNode->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::ComputeAbsoluteTransform(aiNode *pcNode) {
	if (pcNode->mParent) {
		pcNode->mTransformation = pcNode->mParent->mTransformation * pcNode->mTransformation;
	}

	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		ComputeAbsoluteTransform(pcNode->mChildren[i]);
	}
}